

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int get_request_len(char *s,int buf_len)

{
  ushort **ppuVar1;
  int local_2c;
  int i;
  uchar *buf;
  int buf_len_local;
  char *s_local;
  
  local_2c = 0;
  while( true ) {
    if (buf_len <= local_2c) {
      return 0;
    }
    ppuVar1 = __ctype_b_loc();
    if ((((((*ppuVar1)[(int)(uint)(byte)s[local_2c]] & 0x4000) == 0) && (s[local_2c] != '\r')) &&
        (s[local_2c] != '\n')) && ((byte)s[local_2c] < 0x80)) {
      return -1;
    }
    if (((s[local_2c] == '\n') && (local_2c + 1 < buf_len)) && (s[local_2c + 1] == '\n')) {
      return local_2c + 2;
    }
    if (((s[local_2c] == '\n') && (local_2c + 2 < buf_len)) &&
       ((s[local_2c + 1] == '\r' && (s[local_2c + 2] == '\n')))) break;
    local_2c = local_2c + 1;
  }
  return local_2c + 3;
}

Assistant:

static int get_request_len(const char *s, int buf_len) {
    const unsigned char *buf = (unsigned char *) s;
    int i;

    for (i = 0; i < buf_len; i++) {
        if (!isprint(buf[i]) && buf[i] != '\r' && buf[i] != '\n' && buf[i] < 128) {
            return -1;
        } else if (buf[i] == '\n' && i + 1 < buf_len && buf[i + 1] == '\n') {
            return i + 2;
        } else if (buf[i] == '\n' && i + 2 < buf_len && buf[i + 1] == '\r' &&
                   buf[i + 2] == '\n') {
            return i + 3;
        }
    }

    return 0;
}